

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CaseStatementSyntax *pCVar1;
  Token *unaff_RBX;
  Token *unaff_R14;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *unaff_retaddr;
  NamedLabelSyntax **in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  ExpressionSyntax *in_stack_00000040;
  Token *in_stack_00000048;
  Token *in_stack_00000050;
  SyntaxList<slang::syntax::CaseItemSyntax> *in_stack_00000058;
  Token *in_stack_00000060;
  BumpAllocator *in_stack_00000078;
  Token *in_stack_00000080;
  BumpAllocator *in_stack_ffffffffffffff28;
  NamedLabelSyntax *in_stack_ffffffffffffff30;
  NamedLabelSyntax *local_98;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_98 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_98 = deepClone<slang::syntax::NamedLabelSyntax>
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
             (BumpAllocator *)local_98);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa2df49);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  deepClone<slang::syntax::CaseItemSyntax>
            ((SyntaxList<slang::syntax::CaseItemSyntax> *)__child_stack,(BumpAllocator *)local_98);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CaseStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_R14,unaff_RBX,
                      (Token *)__fn,in_stack_00000040,in_stack_00000048,in_stack_00000050,
                      in_stack_00000058,in_stack_00000060);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CaseStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CaseStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.uniqueOrPriority.deepClone(alloc),
        node.caseKeyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc),
        node.matchesOrInside.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.endcase.deepClone(alloc)
    );
}